

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O0

bool __thiscall RealCommandRunner::StartCommand(RealCommandRunner *this,Edge *edge)

{
  bool bVar1;
  pair<Subprocess_*,_Edge_*> local_68;
  undefined4 local_58;
  Subprocess *local_48;
  Subprocess *subproc;
  string command;
  Edge *edge_local;
  RealCommandRunner *this_local;
  
  command.field_2._8_8_ = edge;
  Edge::EvaluateCommand_abi_cxx11_((string *)&subproc,edge,false);
  bVar1 = Edge::use_console((Edge *)command.field_2._8_8_);
  local_48 = SubprocessSet::Add(&this->subprocs_,(string *)&subproc,bVar1);
  bVar1 = local_48 != (Subprocess *)0x0;
  if (bVar1) {
    local_68 = std::make_pair<Subprocess*&,Edge*&>(&local_48,(Edge **)((long)&command.field_2 + 8));
    std::
    map<Subprocess_const*,Edge*,std::less<Subprocess_const*>,std::allocator<std::pair<Subprocess_const*const,Edge*>>>
    ::insert<std::pair<Subprocess*,Edge*>>
              ((map<Subprocess_const*,Edge*,std::less<Subprocess_const*>,std::allocator<std::pair<Subprocess_const*const,Edge*>>>
                *)&this->subproc_to_edge_,&local_68);
  }
  local_58 = 1;
  std::__cxx11::string::~string((string *)&subproc);
  return bVar1;
}

Assistant:

bool RealCommandRunner::StartCommand(Edge* edge) {
  string command = edge->EvaluateCommand();
  Subprocess* subproc = subprocs_.Add(command, edge->use_console());
  if (!subproc)
    return false;
  subproc_to_edge_.insert(make_pair(subproc, edge));

  return true;
}